

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * escapize_string(char *str)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    if ((int)sVar2 != 0) {
      uVar3 = 0;
      uVar7 = sVar2 & 0xffffffff;
      if ((int)sVar2 < 1) {
        uVar7 = uVar3;
      }
      sVar2 = 4;
      for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
        cVar1 = str[uVar3];
        if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == '\"')) {
LAB_001179d5:
          iVar6 = 6;
        }
        else {
          iVar6 = 5;
          if (cVar1 != '&') {
            if (cVar1 == '\'') goto LAB_001179d5;
            if ((cVar1 == '>') || (cVar1 == '<')) {
              iVar6 = 4;
            }
            else {
              iVar6 = 1;
            }
          }
        }
        sVar2 = (size_t)(uint)((int)sVar2 + iVar6);
      }
      pcVar4 = (char *)calloc(1,sVar2);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
        fprintf(_stderr,"** escapize_string: failed to alloc %d bytes\n",sVar2);
      }
      else {
        *pcVar4 = '\'';
        iVar6 = 1;
        for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
          cVar1 = str[uVar3];
          if (cVar1 == '\n') {
            (pcVar4 + (long)iVar6 + 4)[0] = 'a';
            (pcVar4 + (long)iVar6 + 4)[1] = ';';
LAB_00117ab5:
            builtin_strncpy(pcVar4 + iVar6,"&#x0",4);
LAB_00117abd:
            iVar5 = iVar6 + 6;
          }
          else {
            if (cVar1 == '\r') {
              (pcVar4 + (long)iVar6 + 4)[0] = 'd';
              (pcVar4 + (long)iVar6 + 4)[1] = ';';
              goto LAB_00117ab5;
            }
            if (cVar1 == '\"') {
              (pcVar4 + (long)iVar6 + 4)[0] = 't';
              (pcVar4 + (long)iVar6 + 4)[1] = ';';
              builtin_strncpy(pcVar4 + iVar6,"&quo",4);
              goto LAB_00117abd;
            }
            if (cVar1 == '&') {
              pcVar4[(long)iVar6 + 4] = ';';
              builtin_strncpy(pcVar4 + iVar6,"&amp",4);
              iVar5 = iVar6 + 5;
            }
            else {
              if (cVar1 == '\'') {
                (pcVar4 + (long)iVar6 + 4)[0] = 's';
                (pcVar4 + (long)iVar6 + 4)[1] = ';';
                builtin_strncpy(pcVar4 + iVar6,"&apo",4);
                goto LAB_00117abd;
              }
              if (cVar1 == '<') {
                builtin_strncpy(pcVar4 + iVar6,"&lt;",4);
              }
              else {
                if (cVar1 != '>') {
                  iVar5 = iVar6 + 1;
                  pcVar4[iVar6] = cVar1;
                  goto LAB_00117ac2;
                }
                builtin_strncpy(pcVar4 + iVar6,"&gt;",4);
              }
              iVar5 = iVar6 + 4;
            }
          }
LAB_00117ac2:
          iVar6 = iVar5;
        }
        (pcVar4 + iVar6)[0] = '\'';
        (pcVar4 + iVar6)[1] = '\0';
      }
      return pcVar4;
    }
  }
  pcVar4 = nifti_strdup("\'\'");
  return pcVar4;
}

Assistant:

static char *escapize_string( const char * str )
{
   int ii,jj , lstr,lout ;
   char *out ;

   if( str == NULL || (lstr=(int)strlen(str)) == 0 ){      /* 0 length */
     out = nifti_strdup("''") ; return out ;                /* string?? */
   }

   lout = 4 ;                      /* initialize length of output */
   for( ii=0 ; ii < lstr ; ii++ ){ /* count characters for output */
     switch( str[ii] ){
       case '&':  lout += 5 ; break ;  /* replace '&' with "&amp;" */

       case '<':
       case '>':  lout += 4 ; break ;  /* replace '<' with "&lt;" */

       case '"' :
       case '\'': lout += 6 ; break ;  /* replace '"' with "&quot;" */

       case CR:
       case LF:   lout += 6 ; break ;  /* replace CR with "&#x0d;"
                                                  LF with "&#x0a;" */

       default: lout++ ; break ;      /* copy all other chars */
     }
   }
   out = (char *)calloc(1,lout) ;     /* allocate output string */
   if( !out ){
      fprintf(stderr,"** escapize_string: failed to alloc %d bytes\n",lout);
      return NULL;
   }
   out[0] = '\'' ;                    /* opening quote mark */
   for( ii=0,jj=1 ; ii < lstr ; ii++ ){
      switch( str[ii] ){
         default: out[jj++] = str[ii] ; break ;  /* normal characters */

         case '&':  memcpy(out+jj,"&amp;",5)  ; jj+=5 ; break ;

         case '<':  memcpy(out+jj,"&lt;",4)   ; jj+=4 ; break ;
         case '>':  memcpy(out+jj,"&gt;",4)   ; jj+=4 ; break ;

         case '"' : memcpy(out+jj,"&quot;",6) ; jj+=6 ; break ;

         case '\'': memcpy(out+jj,"&apos;",6) ; jj+=6 ; break ;

         case CR:   memcpy(out+jj,"&#x0d;",6) ; jj+=6 ; break ;
         case LF:   memcpy(out+jj,"&#x0a;",6) ; jj+=6 ; break ;
      }
   }
   out[jj++] = '\''  ;  /* closing quote mark */
   out[jj]   = '\0' ;  /* terminate the string */
   return out ;
}